

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O3

Expression *
slang::ast::ConversionExpression::fromSyntax
          (Compilation *compilation,SignedCastExpressionSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  bool bVar2;
  bitmask<slang::ast::IntegralFlags> bVar3;
  bitwidth_t width;
  Expression *args_2;
  ConversionExpression *expr;
  Type *pTVar4;
  SourceLocation location;
  Diagnostic *diag;
  ConversionKind local_44;
  SourceRange local_40;
  
  args_2 = Expression::selfDetermined
                     (compilation,(ExpressionSyntax *)(syntax->inner).ptr,context,
                      (bitmask<slang::ast::ASTFlags>)0x0);
  pTVar4 = compilation->errorType;
  local_44 = Explicit;
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pTVar4,&local_44,args_2,&local_40);
  bVar2 = Expression::bad(args_2);
  if (bVar2) {
LAB_0042ae8a:
    expr = (ConversionExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  else {
    if ((syntax->signing).kind == ConstKeyword) {
      pTVar4 = (args_2->type).ptr;
    }
    else {
      bVar2 = Type::isIntegral((args_2->type).ptr);
      if (!bVar2) {
        location = parsing::Token::location(&syntax->apostrophe);
        diag = ASTContext::addDiag(context,(DiagCode)0x250007,location);
        ast::operator<<(diag,(args_2->type).ptr);
        Diagnostic::operator<<(diag,args_2->sourceRange);
        goto LAB_0042ae8a;
      }
      bVar3 = Type::getIntegralFlags((args_2->type).ptr);
      TVar1 = (syntax->signing).kind;
      width = Type::getBitWidth((args_2->type).ptr);
      pTVar4 = Compilation::getType
                         (compilation,width,
                          (bitmask<slang::ast::IntegralFlags>)
                          (TVar1 == SignedKeyword | bVar3.m_bits & 6));
    }
    (expr->super_Expression).type.ptr = pTVar4;
  }
  return &expr->super_Expression;
}

Assistant:

Expression& ConversionExpression::fromSyntax(Compilation& compilation,
                                             const SignedCastExpressionSyntax& syntax,
                                             const ASTContext& context) {
    auto& operand = selfDetermined(compilation, *syntax.inner, context);
    auto result = compilation.emplace<ConversionExpression>(compilation.getErrorType(),
                                                            ConversionKind::Explicit, operand,
                                                            syntax.sourceRange());
    if (operand.bad())
        return badExpr(compilation, result);

    // SignedCastExpression can also represent a const cast, which does nothing
    // and passes the type through unchanged.
    if (syntax.signing.kind == TokenKind::ConstKeyword) {
        result->type = operand.type;
        return *result;
    }

    if (!operand.type->isIntegral()) {
        auto& diag = context.addDiag(diag::BadIntegerCast, syntax.apostrophe.location());
        diag << *operand.type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    auto flags = operand.type->getIntegralFlags() & ~IntegralFlags::Signed;
    if (syntax.signing.kind == TokenKind::SignedKeyword)
        flags |= IntegralFlags::Signed;

    result->type = &compilation.getType(operand.type->getBitWidth(), flags);
    return *result;
}